

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,ByteData *serialize_data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData256::ByteData256((ByteData256 *)&local_30);
  ExtPubkey(this,serialize_data,(ByteData256 *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(const ByteData& serialize_data)
    : ExtPubkey(serialize_data, ByteData256()) {
  // do nothing
}